

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCameraSceneNode.cpp
# Opt level: O3

void __thiscall
irr::scene::CCameraSceneNode::setRotation(CCameraSceneNode *this,vector3df *rotation)

{
  float fVar1;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  float in_XMM1_Da;
  vector3d<float> vVar2;
  vector3d<float> local_20;
  
  if (this->TargetAndRotationAreBound == true) {
    (*(this->super_ICameraSceneNode).super_ISceneNode._vptr_ISceneNode[0x1d])(this);
    local_20.X = 0.0;
    local_20.Y = 0.0;
    local_20.Z = 1.0;
    vVar2 = core::vector3d<float>::rotationToDirection(rotation,&local_20);
    *(ulong *)&(this->super_ICameraSceneNode).field_0x104 =
         CONCAT44(vVar2.Y + extraout_XMM0_Db,vVar2.X + extraout_XMM0_Da);
    *(float *)&this->field_0x10c = vVar2.Z + in_XMM1_Da;
  }
  (this->super_ICameraSceneNode).super_ISceneNode.RelativeRotation.Z = rotation->Z;
  fVar1 = rotation->Y;
  (this->super_ICameraSceneNode).super_ISceneNode.RelativeRotation.X = rotation->X;
  (this->super_ICameraSceneNode).super_ISceneNode.RelativeRotation.Y = fVar1;
  return;
}

Assistant:

void CCameraSceneNode::setRotation(const core::vector3df &rotation)
{
	if (TargetAndRotationAreBound)
		Target = getAbsolutePosition() + rotation.rotationToDirection();

	ISceneNode::setRotation(rotation);
}